

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_freeDCtx(ZSTD_DCtx *dctx)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  size_t sVar1;
  ZSTD_customMem cMem;
  
  if (dctx == (ZSTD_DCtx *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = 0xffffffffffffffc0;
    if (dctx->staticSize == 0) {
      customMem_00 = dctx->customMem;
      customMem = dctx->customMem;
      ZSTD_freeDDict(dctx->ddictLocal);
      sVar1 = 0;
      dctx->ddictLocal = (ZSTD_DDict *)0x0;
      ZSTD_free(dctx->inBuff,customMem);
      dctx->inBuff = (char *)0x0;
      ZSTD_free(dctx,customMem_00);
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_freeDCtx(ZSTD_DCtx* dctx)
{
    if (dctx==NULL) return 0;   /* support free on NULL */
    if (dctx->staticSize) return ERROR(memory_allocation);   /* not compatible with static DCtx */
    {   ZSTD_customMem const cMem = dctx->customMem;
        ZSTD_freeDDict(dctx->ddictLocal);
        dctx->ddictLocal = NULL;
        ZSTD_free(dctx->inBuff, cMem);
        dctx->inBuff = NULL;
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (dctx->legacyContext)
            ZSTD_freeLegacyStreamContext(dctx->legacyContext, dctx->previousLegacyVersion);
#endif
        ZSTD_free(dctx, cMem);
        return 0;
    }
}